

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O2

int __thiscall cmCPackNSISGenerator::PackageFiles(cmCPackNSISGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  byte bVar3;
  char *pcVar4;
  long lVar5;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  uint uVar9;
  string *psVar10;
  byte bVar11;
  pointer ppcVar12;
  pointer pbVar13;
  pointer remote;
  bool bVar14;
  string local_960;
  string nsisCmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  pointer local_8f8;
  string output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  string componentDescriptions;
  string componentName;
  string nsisFileName;
  ostringstream cmCPackLog_msg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6e8 [35];
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> installTypes;
  int retVal;
  undefined4 uStack_494;
  size_type local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string local_460;
  string defines;
  string tmpFile;
  string installTypesCode;
  string nsisInInstallOptions;
  string nsisInFileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  string nsisInstallOptions;
  string local_360;
  string local_340;
  ostringstream dstr;
  size_type local_318;
  ostringstream str;
  
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xc])
            (&nsisInFileName,this,"NSIS.template.in");
  if (nsisInFileName._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,
                             "CPack error: Could not find NSIS installer template file.");
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x2b,_str);
    std::__cxx11::string::~string((string *)&str);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    uVar9 = 0;
    goto LAB_0014f94a;
  }
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xc])
            (&nsisInInstallOptions,this,"NSIS.InstallOptions.ini.in");
  if (nsisInInstallOptions._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,
                             "CPack error: Could not find NSIS installer options file.");
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x33,_str);
    std::__cxx11::string::~string((string *)&str);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    uVar9 = 0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_TOPLEVEL_DIRECTORY",(allocator<char> *)&str);
    pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nsisFileName,pcVar4,(allocator<char> *)&dstr);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string((string *)&tmpFile,(string *)&nsisFileName);
    std::__cxx11::string::append((char *)&tmpFile);
    std::operator+(&nsisInstallOptions,&nsisFileName,"/NSIS.InstallOptions.ini");
    std::__cxx11::string::append((char *)&nsisFileName);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
    local_8f8 = (this->super_cmCPackGenerator).files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    psVar10 = &(this->super_cmCPackGenerator).toplevel;
    for (pbVar13 = (this->super_cmCPackGenerator).files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar13 != local_8f8;
        pbVar13 = pbVar13 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"$INSTDIR",(allocator<char> *)&dstr);
      cmSystemTools::RelativePath((string *)&dstr,psVar10,pbVar13);
      if ((this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_node_count
          != 0) {
        lVar5 = std::__cxx11::string::find((char)(string *)&dstr,0x2f);
        if (lVar5 == -1) {
          CustomComponentInstallDirectory(&componentName,this,(string *)&dstr);
          std::__cxx11::string::operator=((string *)&cmCPackLog_msg,(string *)&componentName);
        }
        else {
          std::__cxx11::string::substr((ulong)&componentName,(ulong)&dstr);
          CustomComponentInstallDirectory(&nsisCmd,this,&componentName);
          std::__cxx11::string::operator=((string *)&cmCPackLog_msg,(string *)&nsisCmd);
          std::__cxx11::string::~string((string *)&nsisCmd);
        }
        std::__cxx11::string::~string((string *)&componentName);
        std::__cxx11::string::substr((ulong)&componentName,(ulong)&dstr);
        std::__cxx11::string::operator=((string *)&dstr,(string *)&componentName);
        std::__cxx11::string::~string((string *)&componentName);
      }
      componentName._M_dataplus._M_p._0_1_ = 0x2f;
      nsisCmd._M_dataplus._M_p._0_1_ = 0x5c;
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (_dstr,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(_dstr + local_318),(char *)&componentName,(char *)&nsisCmd);
      poVar6 = std::operator<<((ostream *)&str,"  Delete \"");
      poVar6 = std::operator<<(poVar6,(string *)&cmCPackLog_msg);
      poVar6 = std::operator<<(poVar6,"\\");
      poVar6 = std::operator<<(poVar6,(string *)&dstr);
      poVar6 = std::operator<<(poVar6,"\"");
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)&dstr);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,"Uninstall Files: ");
    std::__cxx11::stringbuf::str();
    poVar6 = std::operator<<(poVar6,(string *)&dstr);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string((string *)&dstr);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x53,_dstr);
    std::__cxx11::string::~string((string *)&dstr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_DELETE_FILES",(allocator<char> *)&componentName
              );
    std::__cxx11::stringbuf::str();
    cmCPackGenerator::SetOptionIfNotSet
              (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,_dstr);
    std::__cxx11::string::~string((string *)&dstr);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    dirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetListOfSubdirectories(this,(this->super_cmCPackGenerator).toplevel._M_dataplus._M_p,&dirs);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dstr);
    pbVar13 = dirs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_8f8 = (pointer)&(this->super_cmCPackGenerator).Components;
    for (remote = dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; remote != pbVar13; remote = remote + 1)
    {
      _cmCPackLog_msg = (pointer)local_6e8;
      local_6e8[0]._M_local_buf[0] = '\0';
      cmSystemTools::RelativePath(&componentName,psVar10,remote);
      if (componentName._M_string_length != 0) {
        if (((this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
             _M_node_count != 0) &&
           (lVar5 = std::__cxx11::string::find((char)&componentName,0x2f), lVar5 != -1)) {
          std::__cxx11::string::substr((ulong)&nsisCmd,(ulong)&componentName);
          std::__cxx11::string::operator=((string *)&cmCPackLog_msg,(string *)&nsisCmd);
          std::__cxx11::string::~string((string *)&nsisCmd);
          std::__cxx11::string::substr((ulong)&nsisCmd,(ulong)&componentName);
          std::__cxx11::string::operator=((string *)&componentName,(string *)&nsisCmd);
          std::__cxx11::string::~string((string *)&nsisCmd);
        }
        nsisCmd._M_dataplus._M_p._0_1_ = 0x2f;
        output._M_dataplus._M_p._0_1_ = 0x5c;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )componentName._M_dataplus._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(componentName._M_dataplus._M_p + componentName._M_string_length),
                   (char *)&nsisCmd,(char *)&output);
        CustomComponentInstallDirectory(&nsisCmd,this,(string *)&cmCPackLog_msg);
        poVar6 = std::operator<<((ostream *)&dstr,"  RMDir \"");
        poVar6 = std::operator<<(poVar6,(string *)&nsisCmd);
        poVar6 = std::operator<<(poVar6,"\\");
        poVar6 = std::operator<<(poVar6,(string *)&componentName);
        poVar6 = std::operator<<(poVar6,"\"");
        std::endl<char,std::char_traits<char>>(poVar6);
        std::__cxx11::string::~string((string *)&nsisCmd);
      }
      std::__cxx11::string::~string((string *)&componentName);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,"Uninstall Dirs: ");
    std::__cxx11::stringbuf::str();
    poVar6 = std::operator<<(poVar6,(string *)&componentName);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string((string *)&componentName);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x77,componentName._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&componentName);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_DELETE_DIRECTORIES",(allocator<char> *)&nsisCmd
              );
    std::__cxx11::stringbuf::str();
    cmCPackGenerator::SetOptionIfNotSet
              (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,
               componentName._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&componentName);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,"Configure file: ");
    poVar6 = std::operator<<(poVar6,(string *)&nsisInFileName);
    poVar6 = std::operator<<(poVar6," to ");
    poVar6 = std::operator<<(poVar6,(string *)&nsisFileName);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x7c,componentName._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&componentName);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_MUI_ICON",(allocator<char> *)&nsisCmd);
    bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
LAB_0014e54d:
      _cmCPackLog_msg = (pointer)local_6e8;
      local_6e8[0]._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&componentName,"CPACK_NSIS_MUI_ICON",(allocator<char> *)&nsisCmd);
      bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&componentName);
      std::__cxx11::string::~string((string *)&componentName);
      if (bVar2) {
        std::__cxx11::string::append((char *)&cmCPackLog_msg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&componentName,"CPACK_NSIS_MUI_ICON",(allocator<char> *)&nsisCmd);
        cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&componentName);
        std::__cxx11::string::append((char *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&componentName);
        std::__cxx11::string::append((char *)&cmCPackLog_msg);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&componentName,"CPACK_NSIS_MUI_UNIICON",(allocator<char> *)&nsisCmd);
      bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&componentName);
      std::__cxx11::string::~string((string *)&componentName);
      if (bVar2) {
        std::__cxx11::string::append((char *)&cmCPackLog_msg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&componentName,"CPACK_NSIS_MUI_UNIICON",(allocator<char> *)&nsisCmd);
        cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&componentName);
        std::__cxx11::string::append((char *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&componentName);
        std::__cxx11::string::append((char *)&cmCPackLog_msg);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&componentName,"CPACK_NSIS_INSTALLER_MUI_ICON_CODE",
                 (allocator<char> *)&nsisCmd);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&componentName,_cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&componentName);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&componentName,"CPACK_NSIS_MUI_UNIICON",(allocator<char> *)&output);
      bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&componentName);
      std::__cxx11::string::~string((string *)&componentName);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (bVar2) goto LAB_0014e54d;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_ICON",(allocator<char> *)&componentName);
    bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"!define MUI_HEADERIMAGE_BITMAP \"",
                 (allocator<char> *)&componentName);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&componentName,"CPACK_PACKAGE_ICON",(allocator<char> *)&nsisCmd);
      cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&componentName);
      std::__cxx11::string::append((char *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&componentName);
      std::__cxx11::string::append((char *)&cmCPackLog_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&componentName,"CPACK_NSIS_INSTALLER_ICON_CODE",
                 (allocator<char> *)&nsisCmd);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&componentName,_cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&componentName);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP",
               (allocator<char> *)&componentName);
    bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"!define MUI_WELCOMEFINISHPAGE_BITMAP \"",
                 (allocator<char> *)&componentName);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&componentName,"CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP",
                 (allocator<char> *)&nsisCmd);
      cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&componentName);
      std::__cxx11::string::append((char *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&componentName);
      std::__cxx11::string::append((char *)&cmCPackLog_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&componentName,"CPACK_NSIS_INSTALLER_MUI_WELCOMEFINISH_CODE",
                 (allocator<char> *)&nsisCmd);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&componentName,_cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&componentName);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP",
               (allocator<char> *)&componentName);
    bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"!define MUI_UNWELCOMEFINISHPAGE_BITMAP \"",
                 (allocator<char> *)&componentName);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&componentName,"CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP",
                 (allocator<char> *)&nsisCmd);
      cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&componentName);
      std::__cxx11::string::append((char *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&componentName);
      std::__cxx11::string::append((char *)&cmCPackLog_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&componentName,"CPACK_NSIS_INSTALLER_MUI_UNWELCOMEFINISH_CODE",
                 (allocator<char> *)&nsisCmd);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&componentName,_cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&componentName);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_MUI_FINISHPAGE_RUN",
               (allocator<char> *)&componentName);
    bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"!define MUI_FINISHPAGE_RUN \"$INSTDIR\\",
                 (allocator<char> *)&componentName);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&componentName,"CPACK_NSIS_EXECUTABLES_DIRECTORY",
                 (allocator<char> *)&nsisCmd);
      cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&componentName);
      std::__cxx11::string::append((char *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&componentName);
      std::__cxx11::string::append((char *)&cmCPackLog_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&componentName,"CPACK_NSIS_MUI_FINISHPAGE_RUN",
                 (allocator<char> *)&nsisCmd);
      cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&componentName);
      std::__cxx11::string::append((char *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&componentName);
      std::__cxx11::string::append((char *)&cmCPackLog_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&componentName,"CPACK_NSIS_INSTALLER_MUI_FINISHPAGE_RUN_CODE",
                 (allocator<char> *)&nsisCmd);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&componentName,_cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&componentName);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    if ((this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_node_count
        == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NSIS_INSTALLATION_TYPES",
                 (allocator<char> *)&componentName);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,"");
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                 (allocator<char> *)&componentName);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,"");
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NSIS_PAGE_COMPONENTS",
                 (allocator<char> *)&componentName);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,"");
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NSIS_FULL_INSTALL",
                 (allocator<char> *)&componentName);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,
                 "File /r \"${INST_DIR}\\*.*\"");
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NSIS_COMPONENT_SECTIONS",
                 (allocator<char> *)&componentName);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,"");
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NSIS_COMPONENT_SECTION_LIST",
                 (allocator<char> *)&componentName);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,"");
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NSIS_SECTION_SELECTED_VARS",
                 (allocator<char> *)&componentName);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,"");
      psVar10 = (string *)&cmCPackLog_msg;
    }
    else {
      componentName._M_dataplus._M_p = (pointer)&componentName.field_2;
      componentName._M_string_length = 0;
      nsisCmd._M_dataplus._M_p = (pointer)&nsisCmd.field_2;
      nsisCmd._M_string_length = 0;
      componentName.field_2._M_local_buf[0] = '\0';
      nsisCmd.field_2._M_local_buf[0] = '\0';
      output._M_dataplus._M_p = (pointer)&output.field_2;
      output._M_string_length = 0;
      componentDescriptions._M_dataplus._M_p = (pointer)&componentDescriptions.field_2;
      componentDescriptions._M_string_length = 0;
      output.field_2._M_local_buf[0] = '\0';
      componentDescriptions.field_2._M_local_buf[0] = '\0';
      _retVal = (pointer)&local_488;
      local_490 = 0;
      installTypesCode._M_dataplus._M_p = (pointer)&installTypesCode.field_2;
      installTypesCode._M_string_length = 0;
      local_488._M_local_buf[0] = '\0';
      installTypesCode.field_2._M_local_buf[0] = '\0';
      defines._M_dataplus._M_p = (pointer)&defines.field_2;
      defines._M_string_length = 0;
      defines.field_2._M_local_buf[0] = '\0';
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::vector
                (&installTypes,
                 (this->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.super__Rb_tree_header
                 ._M_node_count,(allocator_type *)&local_960);
      for (p_Var7 = (this->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 !=
          &(this->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        installTypes.
        super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
        _M_impl.super__Vector_impl_data._M_start[p_Var7[4]._M_color - _S_black] =
             (cmCPackInstallationType *)(p_Var7 + 2);
      }
      for (ppcVar12 = installTypes.
                      super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppcVar12 !=
          installTypes.
          super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppcVar12 = ppcVar12 + 1) {
        std::__cxx11::string::append((char *)&installTypesCode);
        std::__cxx11::string::append((string *)&installTypesCode);
        std::__cxx11::string::append((char *)&installTypesCode);
      }
      for (p_Var8 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 !=
          &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        if (*(long *)(p_Var8 + 6) == 0) {
          CreateComponentGroupDescription_abi_cxx11_
                    (&local_960,this,(cmCPackComponentGroup *)(p_Var8 + 2),
                     (ostream *)&cmCPackLog_msg);
          std::__cxx11::string::append((string *)&componentName);
          std::__cxx11::string::~string((string *)&local_960);
        }
        if (p_Var8[4]._M_parent != (_Base_ptr)0x0) {
          std::operator+(&local_3a0,"  !insertmacro MUI_DESCRIPTION_TEXT ${",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var8 + 1));
          std::operator+(&local_8d0,&local_3a0,"} \"");
          std::__cxx11::string::string((string *)&local_340,(string *)(p_Var8 + 4));
          TranslateNewlines(&local_460,&local_340);
          std::operator+(&local_918,&local_8d0,&local_460);
          std::operator+(&local_960,&local_918,"\"\n");
          std::__cxx11::string::append((string *)&retVal);
          std::__cxx11::string::~string((string *)&local_960);
          std::__cxx11::string::~string((string *)&local_918);
          std::__cxx11::string::~string((string *)&local_460);
          std::__cxx11::string::~string((string *)&local_340);
          std::__cxx11::string::~string((string *)&local_8d0);
          std::__cxx11::string::~string((string *)&local_3a0);
        }
      }
      p_Var8 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
               _M_header._M_left;
      bVar11 = 0;
      while ((_Rb_tree_header *)p_Var8 !=
             &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header) {
        bVar3 = bVar11;
        if (p_Var8[9]._M_right != *(_Base_ptr *)(p_Var8 + 10)) {
          bVar3 = *(byte *)&p_Var8[4]._M_parent >> 3;
          if ((bVar11 & 1) != 0) {
            bVar3 = 1;
          }
          if (*(long *)(p_Var8 + 4) == 0) {
            CreateComponentDescription_abi_cxx11_
                      (&local_960,this,(cmCPackComponent *)(p_Var8 + 2),(ostream *)&cmCPackLog_msg);
            std::__cxx11::string::append((string *)&componentName);
            std::__cxx11::string::~string((string *)&local_960);
          }
          std::__cxx11::string::append((char *)&nsisCmd);
          p_Var7 = p_Var8 + 1;
          std::__cxx11::string::append((string *)&nsisCmd);
          std::__cxx11::string::append((char *)&nsisCmd);
          std::operator+(&local_918,"Var ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var7
                        );
          std::operator+(&local_960,&local_918,"_selected\n");
          std::__cxx11::string::append((string *)&output);
          std::__cxx11::string::~string((string *)&local_960);
          std::__cxx11::string::~string((string *)&local_918);
          std::operator+(&local_918,"Var ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var7
                        );
          std::operator+(&local_960,&local_918,"_was_installed\n");
          std::__cxx11::string::append((string *)&output);
          std::__cxx11::string::~string((string *)&local_960);
          std::__cxx11::string::~string((string *)&local_918);
          if (p_Var8[4]._M_right != (_Base_ptr)0x0) {
            std::operator+(&local_3a0,"  !insertmacro MUI_DESCRIPTION_TEXT ${",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var7);
            std::operator+(&local_8d0,&local_3a0,"} \"");
            std::__cxx11::string::string((string *)&local_360,(string *)&p_Var8[4]._M_left);
            TranslateNewlines(&local_460,&local_360);
            std::operator+(&local_918,&local_8d0,&local_460);
            std::operator+(&local_960,&local_918,"\"\n");
            std::__cxx11::string::append((string *)&componentDescriptions);
            std::__cxx11::string::~string((string *)&local_960);
            std::__cxx11::string::~string((string *)&local_918);
            std::__cxx11::string::~string((string *)&local_460);
            std::__cxx11::string::~string((string *)&local_360);
            std::__cxx11::string::~string((string *)&local_8d0);
            std::__cxx11::string::~string((string *)&local_3a0);
          }
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        bVar11 = bVar3;
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append((string *)&componentName);
      std::__cxx11::string::~string((string *)&local_960);
      if (local_490 == 0 && componentDescriptions._M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_960,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                   (allocator<char> *)&local_918);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,&local_960,"!define MUI_COMPONENTSPAGE_NODESC");
      }
      else {
        std::operator+(&local_8d0,"!insertmacro MUI_FUNCTION_DESCRIPTION_BEGIN\n",
                       &componentDescriptions);
        std::operator+(&local_918,&local_8d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&retVal)
        ;
        std::operator+(&local_960,&local_918,"!insertmacro MUI_FUNCTION_DESCRIPTION_END\n");
        std::__cxx11::string::operator=((string *)&componentDescriptions,(string *)&local_960);
        std::__cxx11::string::~string((string *)&local_960);
        std::__cxx11::string::~string((string *)&local_918);
        std::__cxx11::string::~string((string *)&local_8d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_960,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                   (allocator<char> *)&local_918);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,&local_960,componentDescriptions._M_dataplus._M_p);
      }
      std::__cxx11::string::~string((string *)&local_960);
      if ((bVar11 & 1) != 0) {
        std::__cxx11::string::append((char *)&defines);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_960,"CPACK_ADD_REMOVE",(allocator<char> *)&local_918);
        pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_960);
        bVar2 = cmSystemTools::IsOn(pcVar4);
        std::__cxx11::string::~string((string *)&local_960);
        if (bVar2) {
          std::__cxx11::string::append((char *)&defines);
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_960,"CPACK_NSIS_INSTALLATION_TYPES",(allocator<char> *)&local_918)
      ;
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&local_960,installTypesCode._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_960);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_960,"CPACK_NSIS_PAGE_COMPONENTS",(allocator<char> *)&local_918);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&local_960,"!insertmacro MUI_PAGE_COMPONENTS");
      std::__cxx11::string::~string((string *)&local_960);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_960,"CPACK_NSIS_FULL_INSTALL",(allocator<char> *)&local_918);
      cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_960,"");
      std::__cxx11::string::~string((string *)&local_960);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_960,"CPACK_NSIS_COMPONENT_SECTIONS",(allocator<char> *)&local_918)
      ;
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&local_960,componentName._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_960);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_960,"CPACK_NSIS_COMPONENT_SECTION_LIST",
                 (allocator<char> *)&local_918);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&local_960,nsisCmd._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_960);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_960,"CPACK_NSIS_SECTION_SELECTED_VARS",
                 (allocator<char> *)&local_918);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&local_960,output._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_960);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_960,"CPACK_NSIS_DEFINES",(allocator<char> *)&local_918);
      cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_960,defines._M_dataplus._M_p)
      ;
      std::__cxx11::string::~string((string *)&local_960);
      std::_Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::
      ~_Vector_base(&installTypes.
                     super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                   );
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&defines);
      std::__cxx11::string::~string((string *)&installTypesCode);
      std::__cxx11::string::~string((string *)&retVal);
      std::__cxx11::string::~string((string *)&componentDescriptions);
      std::__cxx11::string::~string((string *)&output);
      std::__cxx11::string::~string((string *)&nsisCmd);
      psVar10 = &componentName;
    }
    std::__cxx11::string::~string((string *)psVar10);
    (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xd])
              (this,&nsisInInstallOptions,&nsisInstallOptions,0);
    (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xd])
              (this,&nsisInFileName,&nsisFileName,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nsisCmd,"\"",(allocator<char> *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_INSTALLER_PROGRAM",(allocator<char> *)&componentName
              );
    cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::append((char *)&nsisCmd);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::operator+(&componentName,"\" \"",&nsisFileName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&componentName,"\"");
    std::__cxx11::string::append((string *)&nsisCmd);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&componentName);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,"Execute: ");
    poVar6 = std::operator<<(poVar6,(string *)&nsisCmd);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,300,componentName._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&componentName);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    retVal = 1;
    bVar2 = cmSystemTools::RunSingleCommand
                      (&nsisCmd,&output,&output,&retVal,(char *)0x0,
                       (this->super_cmCPackGenerator).GeneratorVerbose,(cmDuration)0x0);
    bVar14 = retVal != 0;
    if (!bVar2 || bVar14) {
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)&cmCPackLog_msg,&tmpFile,false,None);
      poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,"# Run command: ");
      poVar6 = std::operator<<(poVar6,(string *)&nsisCmd);
      poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<(poVar6,"# Output:");
      poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<(poVar6,(string *)&output);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&componentName);
      poVar6 = std::operator<<((ostream *)&componentName,"Problem running NSIS command: ");
      poVar6 = std::operator<<(poVar6,(string *)&nsisCmd);
      poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<(poVar6,"Please check ");
      poVar6 = std::operator<<(poVar6,(string *)&tmpFile);
      poVar6 = std::operator<<(poVar6," for errors");
      std::endl<char,std::char_traits<char>>(poVar6);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                      ,0x13b,componentDescriptions._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&componentDescriptions);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&componentName);
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&cmCPackLog_msg);
    }
    uVar9 = (uint)(bVar2 && !bVar14);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::~string((string *)&nsisCmd);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dstr);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&dirs);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
    std::__cxx11::string::~string((string *)&nsisInstallOptions);
    std::__cxx11::string::~string((string *)&tmpFile);
    std::__cxx11::string::~string((string *)&nsisFileName);
  }
  std::__cxx11::string::~string((string *)&nsisInInstallOptions);
LAB_0014f94a:
  std::__cxx11::string::~string((string *)&nsisInFileName);
  return uVar9;
}

Assistant:

int cmCPackNSISGenerator::PackageFiles()
{
  // TODO: Fix nsis to force out file name

  std::string nsisInFileName = this->FindTemplate("NSIS.template.in");
  if (nsisInFileName.empty()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPack error: Could not find NSIS installer template file."
                    << std::endl);
    return false;
  }
  std::string nsisInInstallOptions =
    this->FindTemplate("NSIS.InstallOptions.ini.in");
  if (nsisInInstallOptions.empty()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPack error: Could not find NSIS installer options file."
                    << std::endl);
    return false;
  }

  std::string nsisFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  std::string tmpFile = nsisFileName;
  tmpFile += "/NSISOutput.log";
  std::string nsisInstallOptions = nsisFileName + "/NSIS.InstallOptions.ini";
  nsisFileName += "/project.nsi";
  std::ostringstream str;
  for (std::string const& file : files) {
    std::string outputDir = "$INSTDIR";
    std::string fileN = cmSystemTools::RelativePath(toplevel, file);
    if (!this->Components.empty()) {
      const std::string::size_type pos = fileN.find('/');

      // Use the custom component install directory if we have one
      if (pos != std::string::npos) {
        const std::string componentName = fileN.substr(0, pos);
        outputDir = CustomComponentInstallDirectory(componentName);
      } else {
        outputDir = CustomComponentInstallDirectory(fileN);
      }

      // Strip off the component part of the path.
      fileN = fileN.substr(pos + 1);
    }
    std::replace(fileN.begin(), fileN.end(), '/', '\\');

    str << "  Delete \"" << outputDir << "\\" << fileN << "\"" << std::endl;
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Uninstall Files: " << str.str() << std::endl);
  this->SetOptionIfNotSet("CPACK_NSIS_DELETE_FILES", str.str().c_str());
  std::vector<std::string> dirs;
  this->GetListOfSubdirectories(toplevel.c_str(), dirs);
  std::ostringstream dstr;
  for (std::string const& dir : dirs) {
    std::string componentName;
    std::string fileN = cmSystemTools::RelativePath(toplevel, dir);
    if (fileN.empty()) {
      continue;
    }
    if (!Components.empty()) {
      // If this is a component installation, strip off the component
      // part of the path.
      std::string::size_type slash = fileN.find('/');
      if (slash != std::string::npos) {
        // If this is a component installation, determine which component it
        // is.
        componentName = fileN.substr(0, slash);

        // Strip off the component part of the path.
        fileN = fileN.substr(slash + 1);
      }
    }
    std::replace(fileN.begin(), fileN.end(), '/', '\\');

    const std::string componentOutputDir =
      CustomComponentInstallDirectory(componentName);

    dstr << "  RMDir \"" << componentOutputDir << "\\" << fileN << "\""
         << std::endl;
    if (!componentName.empty()) {
      this->Components[componentName].Directories.push_back(std::move(fileN));
    }
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Uninstall Dirs: " << dstr.str() << std::endl);
  this->SetOptionIfNotSet("CPACK_NSIS_DELETE_DIRECTORIES", dstr.str().c_str());

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Configure file: " << nsisInFileName << " to " << nsisFileName
                                   << std::endl);
  if (this->IsSet("CPACK_NSIS_MUI_ICON") ||
      this->IsSet("CPACK_NSIS_MUI_UNIICON")) {
    std::string installerIconCode;
    if (this->IsSet("CPACK_NSIS_MUI_ICON")) {
      installerIconCode += "!define MUI_ICON \"";
      installerIconCode += this->GetOption("CPACK_NSIS_MUI_ICON");
      installerIconCode += "\"\n";
    }
    if (this->IsSet("CPACK_NSIS_MUI_UNIICON")) {
      installerIconCode += "!define MUI_UNICON \"";
      installerIconCode += this->GetOption("CPACK_NSIS_MUI_UNIICON");
      installerIconCode += "\"\n";
    }
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_ICON_CODE",
                            installerIconCode.c_str());
  }
  if (this->IsSet("CPACK_PACKAGE_ICON")) {
    std::string installerIconCode = "!define MUI_HEADERIMAGE_BITMAP \"";
    installerIconCode += this->GetOption("CPACK_PACKAGE_ICON");
    installerIconCode += "\"\n";
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_ICON_CODE",
                            installerIconCode.c_str());
  }

  if (this->IsSet("CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP")) {
    std::string installerBitmapCode =
      "!define MUI_WELCOMEFINISHPAGE_BITMAP \"";
    installerBitmapCode +=
      this->GetOption("CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP");
    installerBitmapCode += "\"\n";
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_WELCOMEFINISH_CODE",
                            installerBitmapCode.c_str());
  }

  if (this->IsSet("CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP")) {
    std::string installerBitmapCode =
      "!define MUI_UNWELCOMEFINISHPAGE_BITMAP \"";
    installerBitmapCode +=
      this->GetOption("CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP");
    installerBitmapCode += "\"\n";
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_UNWELCOMEFINISH_CODE",
                            installerBitmapCode.c_str());
  }

  if (this->IsSet("CPACK_NSIS_MUI_FINISHPAGE_RUN")) {
    std::string installerRunCode = "!define MUI_FINISHPAGE_RUN \"$INSTDIR\\";
    installerRunCode += this->GetOption("CPACK_NSIS_EXECUTABLES_DIRECTORY");
    installerRunCode += "\\";
    installerRunCode += this->GetOption("CPACK_NSIS_MUI_FINISHPAGE_RUN");
    installerRunCode += "\"\n";
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_FINISHPAGE_RUN_CODE",
                            installerRunCode.c_str());
  }

  // Setup all of the component sections
  if (this->Components.empty()) {
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLATION_TYPES", "");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC", "");
    this->SetOptionIfNotSet("CPACK_NSIS_PAGE_COMPONENTS", "");
    this->SetOptionIfNotSet("CPACK_NSIS_FULL_INSTALL",
                            R"(File /r "${INST_DIR}\*.*")");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTIONS", "");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTION_LIST", "");
    this->SetOptionIfNotSet("CPACK_NSIS_SECTION_SELECTED_VARS", "");
  } else {
    std::string componentCode;
    std::string sectionList;
    std::string selectedVarsList;
    std::string componentDescriptions;
    std::string groupDescriptions;
    std::string installTypesCode;
    std::string defines;
    std::ostringstream macrosOut;
    bool anyDownloadedComponents = false;

    // Create installation types. The order is significant, so we first fill
    // in a vector based on the indices, and print them in that order.
    std::vector<cmCPackInstallationType*> installTypes(
      this->InstallationTypes.size());
    for (auto& installType : this->InstallationTypes) {
      installTypes[installType.second.Index - 1] = &installType.second;
    }
    for (cmCPackInstallationType* installType : installTypes) {
      installTypesCode += "InstType \"";
      installTypesCode += installType->DisplayName;
      installTypesCode += "\"\n";
    }

    // Create installation groups first
    for (auto& group : this->ComponentGroups) {
      if (group.second.ParentGroup == nullptr) {
        componentCode +=
          this->CreateComponentGroupDescription(&group.second, macrosOut);
      }

      // Add the group description, if any.
      if (!group.second.Description.empty()) {
        groupDescriptions += "  !insertmacro MUI_DESCRIPTION_TEXT ${" +
          group.first + "} \"" +
          cmCPackNSISGenerator::TranslateNewlines(group.second.Description) +
          "\"\n";
      }
    }

    // Create the remaining components, which aren't associated with groups.
    for (auto& comp : this->Components) {
      if (comp.second.Files.empty()) {
        // NSIS cannot cope with components that have no files.
        continue;
      }

      anyDownloadedComponents =
        anyDownloadedComponents || comp.second.IsDownloaded;

      if (!comp.second.Group) {
        componentCode +=
          this->CreateComponentDescription(&comp.second, macrosOut);
      }

      // Add this component to the various section lists.
      sectionList += R"(  !insertmacro "${MacroName}" ")";
      sectionList += comp.first;
      sectionList += "\"\n";
      selectedVarsList += "Var " + comp.first + "_selected\n";
      selectedVarsList += "Var " + comp.first + "_was_installed\n";

      // Add the component description, if any.
      if (!comp.second.Description.empty()) {
        componentDescriptions += "  !insertmacro MUI_DESCRIPTION_TEXT ${" +
          comp.first + "} \"" +
          cmCPackNSISGenerator::TranslateNewlines(comp.second.Description) +
          "\"\n";
      }
    }

    componentCode += macrosOut.str();

    if (componentDescriptions.empty() && groupDescriptions.empty()) {
      // Turn off the "Description" box
      this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                              "!define MUI_COMPONENTSPAGE_NODESC");
    } else {
      componentDescriptions = "!insertmacro MUI_FUNCTION_DESCRIPTION_BEGIN\n" +
        componentDescriptions + groupDescriptions +
        "!insertmacro MUI_FUNCTION_DESCRIPTION_END\n";
      this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                              componentDescriptions.c_str());
    }

    if (anyDownloadedComponents) {
      defines += "!define CPACK_USES_DOWNLOAD\n";
      if (cmSystemTools::IsOn(this->GetOption("CPACK_ADD_REMOVE"))) {
        defines += "!define CPACK_NSIS_ADD_REMOVE\n";
      }
    }

    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLATION_TYPES",
                            installTypesCode.c_str());
    this->SetOptionIfNotSet("CPACK_NSIS_PAGE_COMPONENTS",
                            "!insertmacro MUI_PAGE_COMPONENTS");
    this->SetOptionIfNotSet("CPACK_NSIS_FULL_INSTALL", "");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTIONS",
                            componentCode.c_str());
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTION_LIST",
                            sectionList.c_str());
    this->SetOptionIfNotSet("CPACK_NSIS_SECTION_SELECTED_VARS",
                            selectedVarsList.c_str());
    this->SetOption("CPACK_NSIS_DEFINES", defines.c_str());
  }

  this->ConfigureFile(nsisInInstallOptions, nsisInstallOptions);
  this->ConfigureFile(nsisInFileName, nsisFileName);
  std::string nsisCmd = "\"";
  nsisCmd += this->GetOption("CPACK_INSTALLER_PROGRAM");
  nsisCmd += "\" \"" + nsisFileName + "\"";
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << nsisCmd << std::endl);
  std::string output;
  int retVal = 1;
  bool res = cmSystemTools::RunSingleCommand(
    nsisCmd, &output, &output, &retVal, nullptr, this->GeneratorVerbose,
    cmDuration::zero());
  if (!res || retVal) {
    cmGeneratedFileStream ofs(tmpFile);
    ofs << "# Run command: " << nsisCmd << std::endl
        << "# Output:" << std::endl
        << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Problem running NSIS command: " << nsisCmd << std::endl
                                                   << "Please check "
                                                   << tmpFile << " for errors"
                                                   << std::endl);
    return 0;
  }
  return 1;
}